

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  word wVar5;
  int iVar6;
  word *pwVar7;
  long lVar8;
  int iVar9;
  
  if (iPivot < 0) {
LAB_0052d7c9:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar3 = iPivot * 2;
  uVar1 = (p->vTimArrs).nSize;
  if (uVar1 == uVar3 || SBORROW4(uVar1,uVar3) != (int)(uVar1 + iPivot * -2) < 0) {
LAB_0052d7e8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = (p->vTimArrs).pArray;
  iVar9 = piVar4[uVar3];
  iVar6 = piVar4[(ulong)uVar3 + 1];
  if (iVar6 < iVar9) {
    iVar6 = iVar9;
  }
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  (p->vSortData).nSize = 0;
  if (0 < vNodes->nSize) {
    lVar8 = 0;
    do {
      uVar1 = vNodes->pArray[lVar8];
      if ((int)uVar1 < 0) goto LAB_0052d7c9;
      if ((p->vTimArrs).nSize <= (int)(uVar1 * 2)) goto LAB_0052d7e8;
      piVar4 = (p->vTimArrs).pArray;
      iVar9 = piVar4[(ulong)uVar1 * 2];
      iVar2 = piVar4[(ulong)uVar1 * 2 + 1];
      if (iVar2 < iVar9) {
        iVar2 = iVar9;
      }
      if (0x3b9ac9fe < iVar2 + 499999999U) {
        __assert_fail("-ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                      ,0x15b,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
      }
      uVar3 = (p->vSortData).nCap;
      if ((p->vSortData).nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          pwVar7 = (p->vSortData).pArray;
          if (pwVar7 == (word *)0x0) {
            pwVar7 = (word *)malloc(0x80);
          }
          else {
            pwVar7 = (word *)realloc(pwVar7,0x80);
          }
          (p->vSortData).pArray = pwVar7;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar3 * 2;
          if (iVar9 <= (int)uVar3) goto LAB_0052d718;
          pwVar7 = (p->vSortData).pArray;
          if (pwVar7 == (word *)0x0) {
            pwVar7 = (word *)malloc((ulong)uVar3 << 4);
          }
          else {
            pwVar7 = (word *)realloc(pwVar7,(ulong)uVar3 << 4);
          }
          (p->vSortData).pArray = pwVar7;
        }
        if (pwVar7 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        (p->vSortData).nCap = iVar9;
      }
LAB_0052d718:
      iVar9 = (p->vSortData).nSize;
      (p->vSortData).nSize = iVar9 + 1;
      (p->vSortData).pArray[iVar9] = CONCAT44(uVar1,iVar2 + 500000000);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodes->nSize);
  }
  Abc_QuickSort3((p->vSortData).pArray,(p->vSortData).nSize,0);
  vNodes->nSize = 0;
  if ((p->vSortData).nSize < 1) {
    iVar9 = -1;
  }
  else {
    iVar9 = -1;
    lVar8 = 0;
    do {
      wVar5 = (p->vSortData).pArray[lVar8];
      Vec_IntPush(vNodes,(int)(wVar5 >> 0x20));
      if (iVar9 == -1) {
        iVar9 = -1;
        if (iVar6 + 500000000 < (int)wVar5 + p->DeltaCrit) {
          iVar9 = (int)lVar8;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vSortData).nSize);
  }
  return iVar9;
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, Time, nDivNew = -1; 
    int MaxDelay = ABC_INFINITY/2+Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
    {
        Time = Sfm_TimArrMaxId( p, Id );
        assert( -ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2 );
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | (ABC_INFINITY/2+Time) );
    }
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}